

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LPO.cpp
# Opt level: O3

Result __thiscall
Kernel::LPO::lexMAE(LPO *this,AppliedTerm s,AppliedTerm t,TermList *sl,TermList *tl,uint arity)

{
  AppliedTerm tt1;
  AppliedTerm tt2;
  int iVar1;
  Result RVar2;
  undefined4 extraout_var;
  ulong uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  TermList *sl_00;
  ulong uVar7;
  TermList *tl_00;
  undefined7 uStack_57;
  undefined7 uStack_3f;
  ulong uVar3;
  undefined4 extraout_var_00;
  
  if (arity != 0) {
    sl_00 = sl + -1;
    tl_00 = tl + -1;
    uVar7 = 0;
    do {
      uVar3 = sl_00[1]._content;
      uVar5 = s.aboveVar;
      if ((((undefined1  [24])s & (undefined1  [24])0x1) != (undefined1  [24])0x0) &&
         ((uVar3 & 1) != 0)) {
        iVar1 = (*(s.applicator)->_vptr_SubstApplicator[2])(s.applicator,uVar3 >> 2 & 0xffffffff);
        uVar3 = CONCAT44(extraout_var,iVar1);
        uVar5 = 0;
      }
      uVar4 = tl_00[1]._content;
      uVar6 = t.aboveVar;
      if ((((undefined1  [24])t & (undefined1  [24])0x1) != (undefined1  [24])0x0) &&
         ((uVar4 & 1) != 0)) {
        iVar1 = (*(t.applicator)->_vptr_SubstApplicator[2])(t.applicator,uVar4 >> 2 & 0xffffffff);
        uVar4 = CONCAT44(extraout_var_00,iVar1);
        uVar6 = 0;
      }
      tt2._9_7_ = uStack_3f;
      tt2.aboveVar = (bool)uVar6;
      tt1._9_7_ = uStack_57;
      tt1.aboveVar = (bool)uVar5;
      tt1.term._content = uVar3;
      tt1.applicator = s.applicator;
      tt2.term._content = uVar4;
      tt2.applicator = t.applicator;
      RVar2 = lpo(this,tt1,tt2);
      if (RVar2 != EQUAL) {
        if (RVar2 != INCOMPARABLE) {
          RVar2 = majo(this,s,t,tl_00,~(uint)uVar7 + arity);
          return RVar2;
        }
        RVar2 = alpha(this,sl_00,~(uint)uVar7 + arity,s,t);
        return RVar2;
      }
      uVar7 = uVar7 + 1;
      sl_00 = sl_00 + -1;
      tl_00 = tl_00 + -1;
    } while (arity != uVar7);
  }
  return EQUAL;
}

Assistant:

Ordering::Result LPO::lexMAE(AppliedTerm s, AppliedTerm t, const TermList* sl, const TermList* tl, unsigned arity) const
{
  for (unsigned i = 0; i < arity; i++) {
    switch (lpo(AppliedTerm(*(sl - i),s), AppliedTerm(*(tl - i),t))) {
    case EQUAL:
      break;
    case GREATER:
      return majo(s, t, tl - i - 1, arity - i - 1);
    case INCOMPARABLE:
      return alpha(sl - i - 1, arity - i - 1, s, t);
    default:
      ASSERTION_VIOLATION;
    }
  }
  return EQUAL;
}